

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

int one_query_count(char *query)

{
  int iVar1;
  MYSQL *pMVar2;
  undefined8 uVar3;
  undefined8 in_RDI;
  int res;
  MYSQL_RES *res_set;
  MYSQL *conn;
  
  pMVar2 = open_conn();
  mysql_query(pMVar2,in_RDI);
  uVar3 = mysql_store_result(pMVar2);
  iVar1 = mysql_affected_rows(pMVar2);
  mysql_free_result(uVar3);
  mysql_close(pMVar2);
  return iVar1;
}

Assistant:

int one_query_count(char *query)
{
	MYSQL *conn;
	MYSQL_RES *res_set;
	int res;

	conn = open_conn();

	mysql_query(conn, query);
	res_set = mysql_store_result(conn);
	res = mysql_affected_rows(conn);

	mysql_free_result(res_set);

	mysql_close(conn);
	return res;
}